

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<false,_false,_false>::pop_block_
          (DaTrie<false,_false,_false> *this,uint32_t block_pos,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  pointer pBVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = block_pos * 0x100;
  if (uVar3 != 0xffffff00) {
    uVar2 = (ulong)uVar3;
    do {
      pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (uVar2 == this->head_pos_) {
        this->head_pos_ = *(uint *)(pBVar1 + uVar2) & 0x7fffffff;
      }
      uVar5 = (ulong)pBVar1[uVar2] & 0x7fffffff;
      uVar4 = (ulong)pBVar1[uVar2] >> 0x20 & 0x7fffffff;
      *(int *)(pBVar1 + uVar4) = (int)uVar5;
      pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar1[uVar5] = (Bc)((ulong)pBVar1[uVar5] & 0x80000000ffffffff | uVar4 << 0x20);
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar3 + 0x100);
  }
  return;
}

Assistant:

void pop_block_(uint32_t block_pos, std::vector<Block>& blocks) {
    auto begin = block_pos * BLOCK_SIZE;
    auto end = begin + BLOCK_SIZE;

    for (auto pos = begin; pos < end; ++pos) {
      if (pos == head_pos_) {
        head_pos_ = next_(head_pos_);
      }
      auto next = next_(pos);
      auto prev = prev_(pos);
      set_next_(prev, next);
      set_prev_(next, prev);
    }
  }